

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary.cpp
# Opt level: O2

void __thiscall Arbitrarychar32_t::~Arbitrarychar32_t(Arbitrarychar32_t *this)

{
  testinator::Test::~Test(&this->super_Test);
  operator_delete(this,0x40);
  return;
}

Assistant:

DEF_TEST(char32_t, Arbitrary)
{
  testinator::Arbitrary<char32_t> a;
  char32_t v = a.generate(0,0);
  a.shrink(v);
  return true;
}